

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_ext_free(lysf_ctx *ctx,lysp_ext *ext)

{
  lysp_ext_instance *local_30;
  lysp_ext_instance *local_20;
  uint64_t c__;
  lysp_ext *ext_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argname);
  lydict_remove(ctx->ctx,ext->dsc);
  lydict_remove(ctx->ctx,ext->ref);
  local_20 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (ext->exts == (lysp_ext_instance *)0x0) {
      local_30 = (lysp_ext_instance *)0x0;
    }
    else {
      local_30 = ext->exts[-1].exts;
    }
    if (local_30 <= local_20) break;
    lysp_ext_instance_free(ctx,ext->exts + (long)local_20);
    local_20 = (lysp_ext_instance *)((long)&local_20->name + 1);
  }
  if (ext->exts != (lysp_ext_instance *)0x0) {
    free(&ext->exts[-1].exts);
  }
  if (ext->compiled != (lysc_ext *)0x0) {
    lysc_extension_free(ctx,&ext->compiled);
  }
  return;
}

Assistant:

static void
lysp_ext_free(struct lysf_ctx *ctx, struct lysp_ext *ext)
{
    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argname);
    lydict_remove(ctx->ctx, ext->dsc);
    lydict_remove(ctx->ctx, ext->ref);
    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
    if (ext->compiled) {
        lysc_extension_free(ctx, &ext->compiled);
    }
}